

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O2

void __thiscall
script_standard_tests::script_standard_Solver_success::script_standard_Solver_success
          (script_standard_Solver_success *this)

{
  long lVar1;
  TestOpts opts;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  opts.coins_db_in_memory = true;
  opts.block_tree_db_in_memory = true;
  opts.setup_net = true;
  opts.setup_validation_interface = true;
  opts._28_4_ = in_stack_ffffffffffffffe4 & 0xffffff00;
  BasicTestingSetup::BasicTestingSetup(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,MAIN,opts);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_Solver_success)
{
    CKey keys[3];
    CPubKey pubkeys[3];
    for (int i = 0; i < 3; i++) {
        keys[i].MakeNewKey(true);
        pubkeys[i] = keys[i].GetPubKey();
    }

    CScript s;
    std::vector<std::vector<unsigned char> > solutions;

    // TxoutType::PUBKEY
    s.clear();
    s << ToByteVector(pubkeys[0]) << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::PUBKEY);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0]));

    // TxoutType::PUBKEYHASH
    s.clear();
    s << OP_DUP << OP_HASH160 << ToByteVector(pubkeys[0].GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::PUBKEYHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0].GetID()));

    // TxoutType::SCRIPTHASH
    CScript redeemScript(s); // initialize with leftover P2PKH script
    s.clear();
    s << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::SCRIPTHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(CScriptID(redeemScript)));

    // TxoutType::MULTISIG
    s.clear();
    s << OP_1 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        OP_2 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::MULTISIG);
    BOOST_CHECK_EQUAL(solutions.size(), 4U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>({1}));
    BOOST_CHECK(solutions[1] == ToByteVector(pubkeys[0]));
    BOOST_CHECK(solutions[2] == ToByteVector(pubkeys[1]));
    BOOST_CHECK(solutions[3] == std::vector<unsigned char>({2}));

    s.clear();
    s << OP_2 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        ToByteVector(pubkeys[2]) <<
        OP_3 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::MULTISIG);
    BOOST_CHECK_EQUAL(solutions.size(), 5U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>({2}));
    BOOST_CHECK(solutions[1] == ToByteVector(pubkeys[0]));
    BOOST_CHECK(solutions[2] == ToByteVector(pubkeys[1]));
    BOOST_CHECK(solutions[3] == ToByteVector(pubkeys[2]));
    BOOST_CHECK(solutions[4] == std::vector<unsigned char>({3}));

    // TxoutType::NULL_DATA
    s.clear();
    s << OP_RETURN <<
        std::vector<unsigned char>({0}) <<
        std::vector<unsigned char>({75}) <<
        std::vector<unsigned char>({255});
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::NULL_DATA);
    BOOST_CHECK_EQUAL(solutions.size(), 0U);

    // TxoutType::WITNESS_V0_KEYHASH
    s.clear();
    s << OP_0 << ToByteVector(pubkeys[0].GetID());
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V0_KEYHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0].GetID()));

    // TxoutType::WITNESS_V0_SCRIPTHASH
    uint256 scriptHash;
    CSHA256().Write(redeemScript.data(), redeemScript.size())
        .Finalize(scriptHash.begin());

    s.clear();
    s << OP_0 << ToByteVector(scriptHash);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V0_SCRIPTHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(scriptHash));

    // TxoutType::WITNESS_V1_TAPROOT
    s.clear();
    s << OP_1 << ToByteVector(uint256::ZERO);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V1_TAPROOT);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(uint256::ZERO));

    // TxoutType::WITNESS_UNKNOWN
    s.clear();
    s << OP_16 << ToByteVector(uint256::ONE);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_UNKNOWN);
    BOOST_CHECK_EQUAL(solutions.size(), 2U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>{16});
    BOOST_CHECK(solutions[1] == ToByteVector(uint256::ONE));

    // TxoutType::ANCHOR
    std::vector<unsigned char> anchor_bytes{0x4e, 0x73};
    s.clear();
    s << OP_1 << anchor_bytes;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::ANCHOR);
    BOOST_CHECK(solutions.empty());

    // Sanity-check IsPayToAnchor
    int version{-1};
    std::vector<unsigned char> witness_program;
    BOOST_CHECK(s.IsPayToAnchor());
    BOOST_CHECK(s.IsWitnessProgram(version, witness_program));
    BOOST_CHECK(CScript::IsPayToAnchor(version, witness_program));

    // TxoutType::NONSTANDARD
    s.clear();
    s << OP_9 << OP_ADD << OP_11 << OP_EQUAL;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::NONSTANDARD);
}